

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::loadensemblemapping(aalcalc *this)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  reference piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  const_iterator it;
  size_t local_48;
  size_t i;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  value_type local_24;
  int local_20;
  value_type local_1c;
  Ensemble e;
  FILE *fin;
  aalcalc *this_local;
  
  e = (Ensemble)fopen("input/ensemble.bin","rb");
  if (e != (Ensemble)0x0) {
    if ((this->ord_output_ & 1U) == 1) {
      fprintf(_stderr,"WARNING: ensembles not compatible with ORD format. Ignoring ensemble file.\n"
             );
    }
    else {
      local_24 = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&this->sidxtoensemble_,(long)(this->samplesize_ + 1),&local_24);
      local_30._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(&this->sidxtoensemble_);
      local_38 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->sidxtoensemble_);
      i._4_4_ = 0;
      std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (local_30,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          local_38,(int *)((long)&i + 4));
      local_48 = fread(&local_20,8,1,(FILE *)e);
      while (vVar1 = local_1c, local_48 != 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->sidxtoensemble_,(long)local_20);
        *pvVar3 = vVar1;
        if (this->max_ensemble_id_ < local_1c) {
          this->max_ensemble_id_ = local_1c;
        }
        local_48 = fread(&local_20,8,1,(FILE *)e);
      }
      it._M_current._4_4_ = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&this->ensemblecount_,(long)(this->max_ensemble_id_ + 1),
                 (value_type *)((long)&it._M_current + 4));
      local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->sidxtoensemble_);
      local_60 = std::next<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            local_68,1);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_58,
                 &local_60);
      while( true ) {
        local_70._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::end(&this->sidxtoensemble_);
        bVar2 = __gnu_cxx::operator!=(&local_58,&local_70);
        if (!bVar2) break;
        piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_58);
        if (*piVar4 == 0) {
          fprintf(_stderr,"FATAL: All sidx must have associated ensemble IDs\n");
          exit(-1);
        }
        piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_58);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->ensemblecount_,(long)*piVar4);
        *pvVar3 = *pvVar3 + 1;
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_58,0);
      }
    }
  }
  return;
}

Assistant:

void aalcalc::loadensemblemapping()
{
	FILE *fin = fopen(ENSEMBLE_FILE, "rb");
	if (fin == NULL) return;
	if (ord_output_ == true) {
		fprintf(stderr, "WARNING: ensembles not compatible with ORD format. Ignoring ensemble file.\n");
		return;
	}

	Ensemble e;
	sidxtoensemble_.resize(samplesize_ + 1, 0);
	std::fill(sidxtoensemble_.begin(), sidxtoensemble_.end(), 0);
	size_t i = fread(&e, sizeof(Ensemble), 1, fin);
	while (i != 0) {
		sidxtoensemble_[e.sidx] = e.ensemble_id;
		if (e.ensemble_id > max_ensemble_id_) {
			max_ensemble_id_ = e.ensemble_id;
		}

		i = fread(&e, sizeof(Ensemble), 1, fin);

	}

	// Check all sidx have ensemble IDs
	// Count how many sidx are associated with each ensemble ID
	ensemblecount_.resize(max_ensemble_id_ + 1, 0);
	for (std::vector<int>::const_iterator it = std::next(sidxtoensemble_.begin());
	     it != sidxtoensemble_.end(); it++) {
		if (*it == 0) {
			fprintf(stderr, "FATAL: All sidx must have associated ensemble IDs\n");
			exit(-1);
		}
		ensemblecount_[*it]++;
	}

}